

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O1

int emulate_storei(int code,reg_type *dest,reg_type *src,long imm)

{
  switch(code) {
  case 0:
  case 1:
    *(char *)((long)src->u + imm) = (dest->u).c.c;
    break;
  case 2:
  case 3:
    *(short *)((long)src->u + imm) = (dest->u).s.s;
    break;
  case 4:
  case 5:
    *(int *)((long)src->u + imm) = (dest->u).i.i;
    break;
  case 6:
  case 7:
  case 8:
    (((anon_union_8_11_4e3cf189_for_u *)((long)src->u + imm))->l).l = (intptr_t)dest->u;
    break;
  case 9:
    *(int *)((long)src->u + imm) = (dest->u).i.i;
    break;
  case 10:
    (((anon_union_8_11_4e3cf189_for_u *)((long)src->u + imm))->l).l = (intptr_t)dest->u;
  }
  return 0;
}

Assistant:

int emulate_storei(int code, struct reg_type *dest, struct reg_type *src, IMM_TYPE imm)
{
    switch(code) {
	case DILL_C: *((char*)(src->u.l.l + imm)) = dest->u.c.c; break;
	case DILL_D: *((double*)(src->u.l.l + imm)) = dest->u.d.d; break;
	case DILL_F: *((float*)(src->u.l.l + imm)) = dest->u.f.f; break;
	case DILL_I: *((int*)(src->u.l.l + imm)) = dest->u.i.i; break;
	case DILL_L: *((IMM_TYPE*)(src->u.l.l + imm)) = dest->u.l.l; break;
	case DILL_S: *((short*)(src->u.l.l + imm)) = dest->u.s.s; break;
	case DILL_U: *((unsigned int *)(src->u.l.l + imm)) = dest->u.u.u; break;
	case DILL_UL: *((UIMM_TYPE *)(src->u.l.l + imm)) = dest->u.ul.ul; break;
	case DILL_US: *((unsigned short *)(src->u.l.l + imm)) = dest->u.us.us; break;
	case DILL_UC: *((unsigned char*)(src->u.l.l + imm)) = dest->u.uc.uc; break;
	case DILL_P: *((void**)((char*)src->u.p.p + imm)) = dest->u.p.p; break;
    }return 0;
}